

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O0

Qiniu_Error
Qiniu_Rio_loadProgresses
          (Qiniu_Rio_PutRet *ret,Qiniu_Rio_PutExtra *extra,Qiniu_Rio_Recorder *recorder)

{
  undefined8 uVar1;
  ulong uVar2;
  Qiniu_Error QVar3;
  undefined8 extraout_RDX;
  undefined1 local_68 [8];
  Qiniu_Rio_BlkputRet blkPutRet;
  int blkIdx;
  Qiniu_Bool hasNext;
  Qiniu_Rio_Recorder *recorder_local;
  Qiniu_Rio_PutExtra *extra_local;
  Qiniu_Rio_PutRet *ret_local;
  Qiniu_Error err;
  
  if (((recorder == (Qiniu_Rio_Recorder *)0x0) ||
      (recorder->recorderMedium == (Qiniu_Record_Medium *)0x0)) || (recorder->toLoadProgresses == 0)
     ) {
LAB_0013e212:
    ret_local = (Qiniu_Rio_PutRet *)Qiniu_OK._0_8_;
    err._0_8_ = Qiniu_OK.message;
  }
  else {
    while( true ) {
      QVar3.code = (*recorder->recorderMedium->hasNextEntry)
                             (recorder->recorderMedium,(Qiniu_Bool *)&blkPutRet.field_0x2c);
      ret_local = (Qiniu_Rio_PutRet *)(ulong)(uint)QVar3.code;
      err._0_8_ = extraout_RDX;
      if (QVar3.code != (Qiniu_Error)0xc8) break;
      if (blkPutRet._44_4_ == 0) goto LAB_0013e212;
      QVar3 = Qiniu_Rio_Recorder_Read_Medium
                        (recorder->recorderMedium,&blkPutRet.economical,
                         (Qiniu_Rio_BlkputRet *)local_68);
      uVar1 = blkPutRet._16_8_;
      err._0_8_ = QVar3.message;
      ret_local = (Qiniu_Rio_PutRet *)(ulong)(uint)QVar3.code;
      if (QVar3.code != 200) break;
      if ((blkPutRet._16_8_ == 0) || (uVar2 = time((time_t *)0x0), uVar2 <= (ulong)uVar1)) {
        memcpy(extra->progresses + blkPutRet.economical,local_68,0x30);
      }
    }
  }
  QVar3._0_8_ = (ulong)ret_local & 0xffffffff;
  QVar3.message = (char *)err._0_8_;
  return QVar3;
}

Assistant:

static Qiniu_Error Qiniu_Rio_loadProgresses(Qiniu_Rio_PutRet *ret, Qiniu_Rio_PutExtra *extra, Qiniu_Rio_Recorder *recorder)
{
    Qiniu_Bool hasNext;
    int blkIdx;
    Qiniu_Rio_BlkputRet blkPutRet;
    if (recorder != NULL && recorder->recorderMedium != NULL && recorder->toLoadProgresses)
    {
        for (;;)
        {
            Qiniu_Error err = recorder->recorderMedium->hasNextEntry(recorder->recorderMedium, &hasNext);
            if (err.code != 200)
            {
                return err;
            }
            if (hasNext)
            {
                err = Qiniu_Rio_Recorder_Read_Medium(recorder->recorderMedium, &blkIdx, &blkPutRet);
                if (err.code != 200)
                {
                    return err;
                }
                if (blkPutRet.expiredAt != 0 && blkPutRet.expiredAt < (Qiniu_Uint64)time(NULL))
                {
                    continue;
                }
                extra->progresses[blkIdx] = blkPutRet;
            }
            else
            {
                break;
            }
        }
    }
    return Qiniu_OK;
}